

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool ra_init_with_capacity(roaring_array_t *new_ra,uint32_t cap)

{
  void **ppvVar1;
  ulong uVar2;
  
  if (new_ra != (roaring_array_t *)0x0) {
    new_ra->keys = (uint16_t *)0x0;
    new_ra->typecodes = (uint8_t *)0x0;
    new_ra->size = 0;
    new_ra->allocation_size = 0;
    new_ra->containers = (void **)0x0;
    new_ra->flags = '\0';
    if (-1 < (int)cap) {
      if (cap == 0) {
        return true;
      }
      uVar2 = (ulong)cap;
      ppvVar1 = (void **)malloc(uVar2 * 0xb);
      if (ppvVar1 != (void **)0x0) {
        new_ra->containers = ppvVar1;
        new_ra->keys = (uint16_t *)(ppvVar1 + uVar2);
        new_ra->typecodes = (uint8_t *)((long)(ppvVar1 + uVar2) + uVar2 * 2);
        new_ra->allocation_size = cap;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool ra_init_with_capacity(roaring_array_t *new_ra, uint32_t cap) {
    if (!new_ra) return false;
    ra_init(new_ra);

    if (cap > INT32_MAX) { return false; }

    if(cap > 0) {
      void *bigalloc = malloc(cap *
                (sizeof(uint16_t) + sizeof(container_t *) + sizeof(uint8_t)));
      if( bigalloc == NULL ) return false;
      new_ra->containers = (container_t **)bigalloc;
      new_ra->keys = (uint16_t *)(new_ra->containers + cap);
      new_ra->typecodes = (uint8_t *)(new_ra->keys + cap);
      // Narrowing is safe because of above check
      new_ra->allocation_size = (int32_t)cap;
    }
    return true;
}